

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::destroyVertex(Solid *this,Vertex *vertex)

{
  HalfEdge **ppHVar1;
  Trait **ppTVar2;
  Vertex *vertex_local;
  Solid *this_local;
  
  ppHVar1 = Vertex::halfedge(vertex);
  if (*ppHVar1 != (HalfEdge *)0x0) {
    __assert_fail("vertex->halfedge () == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                  ,0x56,"void MeshLib::Solid::destroyVertex(Vertex *)");
  }
  ppTVar2 = Vertex::trait(vertex);
  if (*ppTVar2 == (Trait *)0x0) {
    AVL::Tree<MeshLib::Vertex>::remove(&this->m_verts,(char *)vertex);
    if (vertex != (Vertex *)0x0) {
      Vertex::~Vertex(vertex);
      operator_delete(vertex);
    }
    return;
  }
  __assert_fail("vertex->trait () == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,0x57,"void MeshLib::Solid::destroyVertex(Vertex *)");
}

Assistant:

void Solid::destroyVertex(Vertex * vertex)
{
    assert(vertex->halfedge () == NULL);
	assert(vertex->trait () == NULL);

	m_verts.remove (vertex);
    delete vertex;
}